

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void soul::SanityCheckPass::throwErrorIfNotArrayOrVector(Expression *e)

{
  Statement *pSVar1;
  bool bVar2;
  CompileMessage local_70;
  Type local_28;
  Expression *local_10;
  Expression *e_local;
  
  local_10 = e;
  throwErrorIfNotReadableValue(e);
  (*(local_10->super_Statement).super_ASTObject._vptr_ASTObject[4])();
  bVar2 = Type::isArrayOrVector(&local_28);
  Type::~Type(&local_28);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    return;
  }
  pSVar1 = &local_10->super_Statement;
  Errors::expectedArrayOrVector<>();
  AST::Context::throwError(&(pSVar1->super_ASTObject).context,&local_70,false);
}

Assistant:

static void throwErrorIfNotArrayOrVector (AST::Expression& e)
    {
        throwErrorIfNotReadableValue (e);

        if (! e.getResultType().isArrayOrVector())
            e.context.throwError (Errors::expectedArrayOrVector());
    }